

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_maths(int n,mpc_val_t **xs)

{
  undefined8 *in_RSI;
  int **vs;
  
  switch(*(undefined1 *)in_RSI[1]) {
  case 0x25:
    *(int *)*in_RSI = *(int *)*in_RSI % *(int *)in_RSI[2];
    break;
  default:
    break;
  case 0x2a:
    *(int *)*in_RSI = *(int *)in_RSI[2] * *(int *)*in_RSI;
    break;
  case 0x2b:
    *(int *)*in_RSI = *(int *)in_RSI[2] + *(int *)*in_RSI;
    break;
  case 0x2d:
    *(int *)*in_RSI = *(int *)*in_RSI - *(int *)in_RSI[2];
    break;
  case 0x2f:
    *(int *)*in_RSI = *(int *)*in_RSI / *(int *)in_RSI[2];
  }
  free((void *)in_RSI[1]);
  free((void *)in_RSI[2]);
  return (mpc_val_t *)*in_RSI;
}

Assistant:

mpc_val_t *mpcf_maths(int n, mpc_val_t **xs) {
  int **vs = (int**)xs;
  (void) n;

  switch(((char*)xs[1])[0])
  {
    case '*': { *vs[0] *= *vs[2]; }; break;
    case '/': { *vs[0] /= *vs[2]; }; break;
    case '%': { *vs[0] %= *vs[2]; }; break;
    case '+': { *vs[0] += *vs[2]; }; break;
    case '-': { *vs[0] -= *vs[2]; }; break;
    default: break;
  }

  free(xs[1]); free(xs[2]);

  return xs[0];
}